

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O0

_Bool PPC_abs_branch(cs_struct *h,uint id)

{
  int i;
  uint id_local;
  cs_struct *h_local;
  
  i = 0;
  while( true ) {
    if (insn_abs[i] == 0) {
      return false;
    }
    if (id == insn_abs[i]) break;
    i = i + 1;
  }
  return true;
}

Assistant:

bool PPC_abs_branch(cs_struct *h, unsigned int id)
{
	int i;

	for (i = 0; insn_abs[i]; i++) {
		if (id == insn_abs[i]) {
			return true;
		}
	}

	// not found
	return false;
}